

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O3

double normalpdf(double x,double mu,double sigma)

{
  double dVar1;
  
  if (0.0 <= sigma) {
    dVar1 = exp((-(x - mu) * (x - mu)) / ((sigma + sigma) * sigma));
    return dVar1 / (sigma * 2.5066282746310002);
  }
  printf("Standard Deviation (Sigma) must be non-negative");
  exit(1);
}

Assistant:

double normalpdf(double x, double mu, double sigma) {
	double oup,t;
	
	if (sigma < 0.) {
		printf("Standard Deviation (Sigma) must be non-negative");
		exit(1);
	}
	
	t = x - mu;
	t = t * t;
	
	oup = exp(-t / ( 2* sigma *sigma)) / ( sqrt(2 * PIVAL) * sigma);
	
	return oup;
}